

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cpp
# Opt level: O0

bool __thiscall FConfigFile::ReadConfig(FConfigFile *this,void *file)

{
  char *pcVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t sVar3;
  char *pcVar4;
  bool bVar5;
  char *local_1050;
  char *whiteprobe;
  char *endpt;
  char *equalpt;
  char *start;
  FConfigSection *section;
  char readbuf [4096];
  void *file_local;
  FConfigFile *this_local;
  
  start = (char *)0x0;
  ClearConfig(this);
  while( true ) {
    while( true ) {
      do {
        do {
          iVar2 = (*this->_vptr_FConfigFile[3])(this,&section,0x1000,file);
          if (CONCAT44(extraout_var,iVar2) == 0) {
            return true;
          }
          equalpt = (char *)&section;
          while( true ) {
            bVar5 = false;
            if (*equalpt != '\0') {
              bVar5 = *equalpt < '!';
            }
            if (!bVar5) break;
            equalpt = equalpt + 1;
          }
        } while ((*equalpt == '#') || ((*equalpt == '/' && (equalpt[1] == '/'))));
        sVar3 = strlen(equalpt);
        whiteprobe = equalpt + sVar3;
        do {
          pcVar4 = whiteprobe;
          whiteprobe = pcVar4 + -1;
          bVar5 = false;
          if (equalpt < whiteprobe) {
            bVar5 = *whiteprobe < '!';
          }
        } while (bVar5);
        *pcVar4 = '\0';
      } while (whiteprobe <= equalpt);
      if (*equalpt != '[') break;
      if (*whiteprobe == ']') {
        *whiteprobe = '\0';
      }
      start = (char *)NewConfigSection(this,equalpt + 1);
    }
    if (start == (char *)0x0) break;
    pcVar4 = strchr(equalpt,0x3d);
    if ((pcVar4 != (char *)0x0) && (local_1050 = pcVar4, equalpt < pcVar4)) {
      do {
        pcVar1 = local_1050;
        local_1050 = pcVar1 + -1;
        bVar5 = false;
        if (equalpt < local_1050) {
          iVar2 = isspace((int)*local_1050);
          bVar5 = iVar2 != 0;
        }
      } while (bVar5);
      *pcVar1 = '\0';
      do {
        pcVar1 = pcVar4;
        local_1050 = pcVar1 + 1;
        bVar5 = false;
        if (*local_1050 != '\0') {
          iVar2 = isspace((int)*local_1050);
          bVar5 = iVar2 != 0;
        }
        pcVar4 = local_1050;
      } while (bVar5);
      *pcVar1 = '\0';
      if ((((*local_1050 == '<') && (pcVar1[2] == '<')) && (pcVar1[3] == '<')) &&
         (pcVar1[4] != '\0')) {
        ReadMultiLineValue(this,file,(FConfigSection *)start,equalpt,pcVar1 + 4);
      }
      else {
        NewConfigEntry(this,(FConfigSection *)start,equalpt,local_1050);
      }
    }
  }
  return false;
}

Assistant:

bool FConfigFile::ReadConfig (void *file)
{
	char readbuf[READBUFFERSIZE];
	FConfigSection *section = NULL;
	ClearConfig ();

	while (ReadLine (readbuf, READBUFFERSIZE, file) != NULL)
	{
		char *start = readbuf;
		char *equalpt;
		char *endpt;

		// Remove white space at start of line
		while (*start && *start <= ' ')
		{
			start++;
		}
		// Remove comment lines
		if (*start == '#' || (start[0] == '/' && start[1] == '/'))
		{
			continue;
		}
		// Remove white space at end of line
		endpt = start + strlen (start) - 1;
		while (endpt > start && *endpt <= ' ')
		{
			endpt--;
		}
		endpt[1] = 0;
		if (endpt <= start)
			continue;	// Nothing here

		if (*start == '[')
		{ // Section header
			if (*endpt == ']')
				*endpt = 0;
			section = NewConfigSection (start+1);
		}
		else if (section == NULL)
		{
			return false;
		}
		else
		{ // Should be key=value
			equalpt = strchr (start, '=');
			if (equalpt != NULL && equalpt > start)
			{
				// Remove white space in front of =
				char *whiteprobe = equalpt - 1;
				while (whiteprobe > start && isspace(*whiteprobe))
				{
					whiteprobe--;
				}
				whiteprobe[1] = 0;
				// Remove white space after =
				whiteprobe = equalpt + 1;
				while (*whiteprobe && isspace(*whiteprobe))
				{
					whiteprobe++;
				}
				*(whiteprobe - 1) = 0;
				// Check for multi-line value
				if (whiteprobe[0] == '<' && whiteprobe[1] == '<' && whiteprobe[2] == '<' && whiteprobe[3] != '\0')
				{
					ReadMultiLineValue (file, section, start, whiteprobe + 3);
				}
				else
				{
					NewConfigEntry (section, start, whiteprobe);
				}
			}
		}
	}
	return true;
}